

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

uint8_t sysbvm_tuple_byteSlotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t byteValue;
  size_t slotIndex_local;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isDummyValue(tuple);
  if (_Var1) {
    sysbvm_error_accessDummyValue();
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isBytes(tuple);
    if (!_Var1) {
      sysbvm_error("Expected a byte tuple.");
    }
    sVar2 = sysbvm_tuple_getSizeInBytes(tuple);
    if (slotIndex < sVar2) {
      context_local._7_1_ = *(uint8_t *)(tuple + 0x10 + slotIndex);
    }
    else {
      sysbvm_error_outOfBoundsSlotAccess();
      context_local._7_1_ = '\0';
    }
  }
  else if (slotIndex < 8) {
    context_local._7_1_ = (uint8_t)((long)tuple >> ((char)(slotIndex << 3) + 4U & 0x3f));
  }
  else {
    context_local._7_1_ = '\0';
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API uint8_t sysbvm_tuple_byteSlotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();

    if(!sysbvm_tuple_isNonNullPointer(tuple))
    {
        if(slotIndex < sizeof(sysbvm_tuple_t))
        {
            sysbvm_tuple_t byteValue = ( ((sysbvm_stuple_t)tuple) >> (SYSBVM_TUPLE_TAG_BIT_COUNT + slotIndex*8)) & 0xFF;
            return (uint8_t)byteValue;
        }

        return 0;
    }

    if(!sysbvm_tuple_isBytes(tuple)) sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex];

    sysbvm_error_outOfBoundsSlotAccess();
    return 0;
}